

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O2

void spr_write_ebb(DisasContext_conflict10 *ctx,int sprn,int gprn)

{
  int in_R8D;
  
  gen_fscr_facility_check(ctx,7,sprn,7,in_R8D);
  spr_write_generic(ctx,sprn,gprn);
  return;
}

Assistant:

static void spr_write_ebb(DisasContext *ctx, int sprn, int gprn)
{
    gen_fscr_facility_check(ctx, SPR_FSCR, FSCR_EBB, sprn, FSCR_IC_EBB);
    spr_write_generic(ctx, sprn, gprn);
}